

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTreeTest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  BSTree<int> *this;
  long *plVar1;
  BSTNode<int> *pBVar2;
  BSTNode<int> *pBVar3;
  int *item;
  pointer piVar4;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  int local_38 [8];
  
  local_38[4] = 2;
  local_38[5] = 7;
  local_38[6] = 6;
  local_38[7] = 8;
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 4;
  local_38[3] = 3;
  __l._M_len = 8;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_51);
  this = (BSTree<int> *)operator_new(8);
  this->mRoot = (BSTNode<int> *)0x0;
  piVar4 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      BSTree<int>::insert(this,*piVar4);
      piVar4 = piVar4 + 1;
    } while (piVar4 != local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    pBVar2 = this->mRoot;
    if (pBVar2 != (BSTNode<int> *)0x0) {
      BSTree<int>::print(this,pBVar2,pBVar2->key,0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  pBVar2 = this->mRoot;
  pBVar3 = pBVar2;
  do {
    if (pBVar3 == (BSTNode<int> *)0x0) goto LAB_001013af;
    pBVar3 = pBVar3->right;
  } while (pBVar3 != (BSTNode<int> *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maxmum: ",8);
  pBVar2 = this->mRoot;
  do {
    pBVar3 = pBVar2;
    if (pBVar3 == (BSTNode<int> *)0x0) break;
    pBVar2 = pBVar3->right;
  } while (pBVar3->right != (BSTNode<int> *)0x0);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,pBVar3->key);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  pBVar2 = this->mRoot;
LAB_001013af:
  do {
    if (pBVar2 == (BSTNode<int> *)0x0) goto LAB_00101421;
    pBVar2 = pBVar2->left;
  } while (pBVar2 != (BSTNode<int> *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"minimum: ",9);
  pBVar2 = this->mRoot;
  do {
    pBVar3 = pBVar2;
    if (pBVar3 == (BSTNode<int> *)0x0) break;
    pBVar2 = pBVar3->left;
  } while (pBVar3->left != (BSTNode<int> *)0x0);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,pBVar3->key);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
LAB_00101421:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::preOrder(this,this->mRoot);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::inOrder(this,this->mRoot);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::postOrder(this,this->mRoot);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test seach:",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,3);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  BSTree<int>::remove(this,(char *)0x5);
  pBVar2 = this->mRoot;
  if (pBVar2 != (BSTNode<int> *)0x0) {
    BSTree<int>::print(this,pBVar2,pBVar2->key,0);
  }
  BSTree<int>::destroy(this,(BSTNode<int> **)this);
  operator_delete(this,8);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	vector<int> data = {1, 5, 4, 3, 2, 7, 6, 8};
	BSTree<int>* tree =  new BSTree<int>();

	for (const auto& item : data)
		tree->insert(item);

	tree->print();

	cout << "====================================" << endl;
	if (tree->maxmum() != nullptr)
		cout << "maxmum: " << tree->maxmum()->key << endl;
	if (tree->minimum() != nullptr )
		cout << "minimum: " << tree->minimum()->key << endl;

	cout << "====================================" << endl;
	tree->preOrder();
	cout << endl;
	cout << "====================================" << endl;


	tree->inOrder();
	cout << endl;
	cout << "====================================" << endl;

	tree->postOrder();
	cout << endl;
	cout << "====================================" << endl;

	cout << "Test seach:" << endl;
	cout << tree->search(3)->key<< endl;
	cout << "====================================" << endl;

	tree->remove(5);
	tree->print();

	delete tree;

	return 0;
}